

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_slice_layer_rbsp(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_data_rbsp_t *psVar2;
  uint8_t *puVar3;
  int iVar4;
  uint8_t *__dest;
  
  if (h->nal->nal_unit_type == 0x14) {
    read_slice_header_in_scalable_extension(h,b);
  }
  else {
    read_slice_header(h,b);
  }
  psVar2 = h->slice_data;
  if (psVar2 != (slice_data_rbsp_t *)0x0) {
    free(psVar2->rbsp_buf);
    iVar1 = b->bits_left;
    puVar3 = b->p;
    iVar4 = (int)b->end - (int)(puVar3 + (iVar1 != 0));
    psVar2->rbsp_size = iVar4;
    __dest = (uint8_t *)malloc((long)iVar4);
    psVar2->rbsp_buf = __dest;
    memcpy(__dest,puVar3 + (iVar1 != 0),(long)iVar4);
    return;
  }
  read_rbsp_slice_trailing_bits(h,b);
  return;
}

Assistant:

void read_slice_layer_rbsp(h264_stream_t* h,  bs_t* b)
{
    if (h->nal->nal_unit_type != NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION)
        read_slice_header(h, b);
    else
        read_slice_header_in_scalable_extension(h, b);
    
    slice_data_rbsp_t* slice_data = h->slice_data;

    if ( slice_data != NULL )
    {
        if ( slice_data->rbsp_buf != NULL ) free( slice_data->rbsp_buf ); 
        uint8_t *sptr = b->p + (!!b->bits_left); // CABAC-specific: skip alignment bits, if there are any
        slice_data->rbsp_size = b->end - sptr;
        
        slice_data->rbsp_buf = (uint8_t*)malloc(slice_data->rbsp_size);
        memcpy( slice_data->rbsp_buf, sptr, slice_data->rbsp_size );
        // ugly hack: since next NALU starts at byte border, we are going to be padded by trailing_bits;
        return;
    }

    // FIXME should read or skip data
    //slice_data( ); /* all categories of slice_data( ) syntax */
    read_rbsp_slice_trailing_bits(h, b);
}